

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstdpp.hpp
# Opt level: O2

buffer_t *
zstdpp::compress(buffer_t *__return_storage_ptr__,string_t *data,compress_level_t compress_level)

{
  buffer_t comp_buffer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  utils::to_bytes((buffer_t *)&local_30,data);
  compress(__return_storage_ptr__,(buffer_t *)&local_30,compress_level);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline buffer_t compress(const string_t data, compress_level_t compress_level) {
    auto comp_buffer = utils::to_bytes(data);
    return compress(comp_buffer, compress_level);
}